

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData,int>
          (ArgBuilder *this,_func_void_ConfigData_ptr_int *binaryFunction,string *placeholder)

{
  Arg *pAVar1;
  IArgFunction<Catch::ConfigData> *pIVar2;
  undefined8 *puVar3;
  IArgFunction<Catch::ConfigData> *pIVar4;
  undefined **ppuVar5;
  
  puVar3 = (undefined8 *)operator_new(0x10);
  ppuVar5 = &PTR__IArgFunction_00163918;
  *puVar3 = &PTR__IArgFunction_00163918;
  puVar3[1] = binaryFunction;
  pAVar1 = this->m_arg;
  pIVar4 = (IArgFunction<Catch::ConfigData> *)operator_new(0x10);
  pIVar4->_vptr_IArgFunction = (_func_int **)&PTR__IArgFunction_00163918;
  pIVar4[1]._vptr_IArgFunction = (_func_int **)binaryFunction;
  pIVar2 = (pAVar1->super_CommonArgProperties<Catch::ConfigData>).boundField.functionObj;
  if (pIVar2 != (IArgFunction<Catch::ConfigData> *)0x0) {
    (*pIVar2->_vptr_IArgFunction[1])();
    ppuVar5 = (undefined **)*puVar3;
  }
  (pAVar1->super_CommonArgProperties<Catch::ConfigData>).boundField.functionObj = pIVar4;
  (*(code *)ppuVar5[1])(puVar3);
  std::__cxx11::string::_M_assign
            ((string *)&(this->m_arg->super_CommonArgProperties<Catch::ConfigData>).placeholder);
  return;
}

Assistant:

void bind( void (* binaryFunction)( C&, T ), std::string const& placeholder ) {
                m_arg->boundField = new Detail::BoundBinaryFunction<C, T>( binaryFunction );
                m_arg->placeholder = placeholder;
            }